

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkCrossCut(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  int local_24;
  uint local_20;
  int i;
  int nCutSizeMax;
  int nCutSize;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  i = 0;
  local_20 = 0;
  pObj = (Abc_Obj_t *)pNtk;
  Abc_NtkCleanCopy(pNtk);
  Abc_NtkIncrementTravId((Abc_Ntk_t *)pObj);
  for (local_24 = 0; iVar2 = Abc_NtkCoNum((Abc_Ntk_t *)pObj), uVar1 = local_20, local_24 < iVar2;
      local_24 = local_24 + 1) {
    _nCutSizeMax = Abc_NtkCo((Abc_Ntk_t *)pObj,local_24);
    Abc_NtkCrossCut_rec(_nCutSizeMax,&i,(int *)&local_20);
    i = i + -1;
  }
  if (i != 0) {
    __assert_fail("nCutSize == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x80c,"int Abc_NtkCrossCut(Abc_Ntk_t *)");
  }
  dVar3 = (double)(int)local_20;
  iVar2 = Abc_NtkObjNum((Abc_Ntk_t *)pObj);
  printf("Max cross cut size = %6d.  Ratio = %6.2f %%\n",(dVar3 * 100.0) / (double)iVar2,
         (ulong)uVar1);
  return local_20;
}

Assistant:

int Abc_NtkCrossCut( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int nCutSize = 0, nCutSizeMax = 0;
    int i;
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Abc_NtkCrossCut_rec( pObj, &nCutSize, &nCutSizeMax );
        nCutSize--;
    }
    assert( nCutSize == 0 );
    printf( "Max cross cut size = %6d.  Ratio = %6.2f %%\n", nCutSizeMax, 100.0 * nCutSizeMax/Abc_NtkObjNum(pNtk) );
    return nCutSizeMax;
}